

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86::forward_int8_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 uVar1;
  int *piVar8;
  int iVar9;
  _func_int **pp_Var10;
  Convolution *this_00;
  Mat top_blob_tm;
  void *ptr;
  Option opt_g;
  Option opt_g_1;
  Mat local_70;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined3 uVar4;
  undefined1 uVar5;
  undefined2 uVar6;
  undefined1 uVar7;
  
  pp_Var10 = this->_vptr_Convolution_x86;
  this_00 = (Convolution *)((long)&this->_vptr_Convolution_x86 + (long)pp_Var10[-3]);
  if ((*(int *)(pp_Var10[-3] + 4 + (long)&(this->weight_3x3_winograd23_data_int8).data) < 2) &&
     (this_00->dilation_h < 2)) {
    local_70.elemsize = bottom_blob->elemsize;
    local_70.data = bottom_blob->data;
    local_70.refcount = bottom_blob->refcount;
    local_70.elempack = bottom_blob->elempack;
    local_70.allocator = bottom_blob->allocator;
    local_70.dims = bottom_blob->dims;
    local_70.w = bottom_blob->w;
    local_70.h = bottom_blob->h;
    local_70.c = bottom_blob->c;
    local_70.cstep = bottom_blob->cstep;
    if (local_70.refcount != (int *)0x0) {
      LOCK();
      *local_70.refcount = *local_70.refcount + 1;
      UNLOCK();
      pp_Var10 = this->_vptr_Convolution_x86;
    }
    if (local_70.elemsize != 1) {
      opt_g.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_g.use_packing_layout = opt->use_packing_layout;
      opt_g.use_shader_pack8 = opt->use_shader_pack8;
      opt_g.use_bf16_storage = opt->use_bf16_storage;
      opt_g._36_4_ = *(undefined4 *)&opt->field_0x24;
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      uVar1._0_1_ = opt->use_winograd_convolution;
      uVar1._1_1_ = opt->use_sgemm_convolution;
      uVar1._2_1_ = opt->use_int8_inference;
      uVar1._3_1_ = opt->use_vulkan_compute;
      uVar2 = opt->use_fp16_packed;
      uVar3 = opt->use_fp16_storage;
      uVar5 = opt->use_fp16_arithmetic;
      uVar7 = opt->use_int8_storage;
      uVar6 = CONCAT11(uVar7,uVar5);
      uVar4 = CONCAT21(uVar6,uVar3);
      uVar1._4_4_ = CONCAT31(uVar4,uVar2);
      opt_g.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
      opt_g.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      opt_g._24_4_ = SUB84(uVar1,0);
      opt_g.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
      opt_g.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
      opt_g._28_4_ = uVar1._4_4_;
      quantize_float32_to_int8
                (bottom_blob,&local_70,*(float *)(&this->field_0x1f8 + (long)pp_Var10[-3]),&opt_g);
      pp_Var10 = this->_vptr_Convolution_x86;
    }
    opt_g.workspace_allocator._0_4_ = 0;
    opt_g.workspace_allocator._4_4_ = 0;
    opt_g.use_winograd_convolution = false;
    opt_g.use_sgemm_convolution = false;
    opt_g.use_int8_inference = false;
    opt_g.use_vulkan_compute = false;
    opt_g.lightmode = false;
    opt_g._1_3_ = 0;
    opt_g.num_threads = 0;
    opt_g.blob_allocator._0_4_ = 0;
    opt_g.blob_allocator._4_4_ = 0;
    opt_g.use_int8_arithmetic = false;
    opt_g.use_packing_layout = false;
    opt_g.use_shader_pack8 = false;
    opt_g.use_bf16_storage = false;
    opt_g._36_4_ = 0;
    Convolution::make_padding
              ((Convolution *)((long)&this->_vptr_Convolution_x86 + (long)pp_Var10[-3]),&local_70,
               (Mat *)&opt_g,opt);
    piVar8 = (int *)CONCAT44(opt_g.blob_allocator._4_4_,opt_g.blob_allocator._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (opt_g._32_8_ == 0) {
          if (opt_g._0_8_ != 0) {
            free((void *)opt_g._0_8_);
          }
        }
        else {
          (**(code **)(*(long *)opt_g._32_8_ + 0x18))();
        }
      }
    }
    if (local_70.refcount != (int *)0x0) {
      LOCK();
      *local_70.refcount = *local_70.refcount + -1;
      UNLOCK();
      if (*local_70.refcount == 0) {
        if (local_70.allocator == (Allocator *)0x0) {
          if (local_70.data != (void *)0x0) {
            free(local_70.data);
          }
        }
        else {
          (**(code **)(*(long *)local_70.allocator + 0x18))();
        }
      }
    }
    return -100;
  }
  iVar9 = Convolution::forward(this_00,bottom_blob,top_blob,opt);
  return iVar9;
}

Assistant:

int Convolution_x86::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (dilation_w > 1 || dilation_h > 1)
    {
        return Convolution::forward(bottom_blob, top_blob, opt);
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (elemsize != 1)
    {
        Option opt_g = opt;
        opt_g.blob_allocator = opt.workspace_allocator;

        quantize_float32_to_int8(bottom_blob, bottom_blob_unbordered, bottom_blob_int8_scale, opt_g);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_unbordered, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // int8
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // int8
    if (use_int8_requantize)
    {
        Mat top_blob_tm;
        top_blob_tm.create(outw, outh, num_output, (size_t)4u, opt.workspace_allocator);
        if (top_blob_tm.empty())
            return -100;

        if (use_winograd3x3_int8)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data_int8, opt);
//             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob_tm, weight_3x3_winograd23_data_int8, opt);

            // requantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_tm_g = top_blob_tm.channel_range(p, 1);
                Mat top_blob_g = top_blob.channel_range(p, 1);

                // requantize and relu
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                float scale_out = top_blob_int8_scale;//FIXME load param

                requantize_int8_to_int8(top_blob_tm_g, top_blob_g, scale_in, scale_out, bias_term ? (const float*)bias_data + p : 0, bias_term ? 1 : 0, 0, opt_g);
            }
        }
        else
        {
            std::vector<float> requantize_scales;
            for (int p=0; p<num_output; p++)
            {
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                float scale_out = top_blob_int8_scale;

                requantize_scales.push_back(scale_in);
                requantize_scales.push_back(scale_out);
            }

            conv_im2col_sgemm_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, requantize_scales, opt);
        }
    }
    else
    {
        if (use_winograd3x3_int8)
        {
            conv3x3s1_winograd23_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data_int8, opt);
//             conv3x3s1_winograd43_int8_sse(bottom_blob_bordered, top_blob, weight_3x3_winograd23_data_int8, opt);

            // dequantize, reverse scale inplace
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p=0; p<num_output; p++)
            {
                Option opt_g = opt;
                opt_g.num_threads = 1;
                opt_g.blob_allocator = top_blob.allocator;

                Mat top_blob_g = top_blob.channel_range(p, 1);

                // dequantize
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                dequantize_int32_to_float32(top_blob_g, scale_in, bias_term ? (const float*)bias_data + p : 0, bias_term ? 1 : 0, opt_g);
            }
        }
        else
        {
            std::vector<float> dequantize_scales;
            for (int p=0; p<num_output; p++)
            {
                float scale_in;
                if (weight_data_int8_scales[p] == 0)
                    scale_in = 0;
                else
                    scale_in = 1.f / (bottom_blob_int8_scale * weight_data_int8_scales[p]);

                dequantize_scales.push_back(scale_in);
            }

            conv_im2col_sgemm_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, kernel_w, kernel_h, stride_w, stride_h, bias_data, dequantize_scales, opt);
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}